

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

bcf_hrec_t * bcf_hdr_get_hrec(bcf_hdr_t *hdr,int type,char *key,char *value,char *str_class)

{
  int iVar1;
  khint_t kVar2;
  int local_64;
  kh_vdict_t *local_58;
  khint_t k;
  vdict_t *d;
  int j;
  int i;
  char *str_class_local;
  char *value_local;
  char *key_local;
  int type_local;
  bcf_hdr_t *hdr_local;
  
  if (type == 5) {
    for (d._4_4_ = 0; d._4_4_ < hdr->nhrec; d._4_4_ = d._4_4_ + 1) {
      if (((hdr->hrec[d._4_4_]->type == 5) &&
          (iVar1 = strcmp(hdr->hrec[d._4_4_]->key,key), iVar1 == 0)) &&
         ((value == (char *)0x0 || (iVar1 = strcmp(hdr->hrec[d._4_4_]->value,value), iVar1 == 0))))
      {
        return hdr->hrec[d._4_4_];
      }
    }
    hdr_local = (bcf_hdr_t *)0x0;
  }
  else if (type == 4) {
    for (d._4_4_ = 0; d._4_4_ < hdr->nhrec; d._4_4_ = d._4_4_ + 1) {
      if ((((hdr->hrec[d._4_4_]->type == 4) &&
           (iVar1 = strcmp(hdr->hrec[d._4_4_]->key,str_class), iVar1 == 0)) &&
          (iVar1 = bcf_hrec_find_key(hdr->hrec[d._4_4_],key), -1 < iVar1)) &&
         (iVar1 = strcmp(hdr->hrec[d._4_4_]->vals[iVar1],value), iVar1 == 0)) {
        return hdr->hrec[d._4_4_];
      }
    }
    hdr_local = (bcf_hdr_t *)0x0;
  }
  else {
    if (type == 3) {
      local_58 = (kh_vdict_t *)hdr->dict[1];
    }
    else {
      local_58 = (kh_vdict_t *)hdr->dict[0];
    }
    kVar2 = kh_get_vdict(local_58,value);
    if (kVar2 == local_58->n_buckets) {
      hdr_local = (bcf_hdr_t *)0x0;
    }
    else {
      local_64 = type;
      if (type == 3) {
        local_64 = 0;
      }
      hdr_local = (bcf_hdr_t *)local_58->vals[kVar2].hrec[local_64];
    }
  }
  return (bcf_hrec_t *)hdr_local;
}

Assistant:

bcf_hrec_t *bcf_hdr_get_hrec(const bcf_hdr_t *hdr, int type, const char *key, const char *value, const char *str_class)
{
    int i;
    if ( type==BCF_HL_GEN )
    {
        for (i=0; i<hdr->nhrec; i++)
        {
            if ( hdr->hrec[i]->type!=type ) continue;
            if ( strcmp(hdr->hrec[i]->key,key) ) continue;
            if ( !value || !strcmp(hdr->hrec[i]->value,value) ) return hdr->hrec[i];
        }
        return NULL;
    }
    else if ( type==BCF_HL_STR )
    {
        for (i=0; i<hdr->nhrec; i++)
        {
            if ( hdr->hrec[i]->type!=type ) continue;
            if ( strcmp(hdr->hrec[i]->key,str_class) ) continue;
            int j = bcf_hrec_find_key(hdr->hrec[i],key);
            if ( j>=0 && !strcmp(hdr->hrec[i]->vals[j],value) ) return hdr->hrec[i];
        }
        return NULL;
    }
    vdict_t *d = type==BCF_HL_CTG ? (vdict_t*)hdr->dict[BCF_DT_CTG] : (vdict_t*)hdr->dict[BCF_DT_ID];
    khint_t k = kh_get(vdict, d, value);
    if ( k == kh_end(d) ) return NULL;
    return kh_val(d, k).hrec[type==BCF_HL_CTG?0:type];
}